

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::~VulkanSyncObjectManager(VulkanSyncObjectManager *this)

{
  VkFence pVVar1;
  PFN_vkDestroyFence p_Var2;
  PFN_vkDestroySemaphore p_Var3;
  bool bVar4;
  reference ppVVar5;
  reference ppVVar6;
  VkDevice pVVar7;
  VkFence_T *vkFence;
  iterator __end2_1;
  iterator __begin2_1;
  vector<VkFence_T_*,_std::allocator<VkFence_T_*>_> *__range2_1;
  lock_guard<std::mutex> Lock_1;
  VkSemaphore_T *vkSem;
  iterator __end2;
  iterator __begin2;
  vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_> *__range2;
  lock_guard<std::mutex> Lock;
  VulkanSyncObjectManager *this_local;
  
  Lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range2,&this->m_SemaphorePoolGuard);
  __end2 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::begin
                     (&this->m_SemaphorePool);
  vkSem = (VkSemaphore_T *)
          std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::end
                    (&this->m_SemaphorePool);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<VkSemaphore_T_**,_std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>_>
                                *)&vkSem);
    if (!bVar4) break;
    ppVVar5 = __gnu_cxx::
              __normal_iterator<VkSemaphore_T_**,_std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>_>
              ::operator*(&__end2);
    p_Var3 = vkDestroySemaphore;
    Lock_1._M_device = (mutex_type *)*ppVVar5;
    pVVar7 = VulkanLogicalDevice::GetVkDevice(this->m_LogicalDevice);
    (*p_Var3)(pVVar7,(VkSemaphore)Lock_1._M_device,(VkAllocationCallbacks *)0x0);
    __gnu_cxx::
    __normal_iterator<VkSemaphore_T_**,_std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>_>
    ::operator++(&__end2);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range2_1,&this->m_FencePoolGuard);
  __end2_1 = std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::begin(&this->m_FencePool);
  vkFence = (VkFence_T *)
            std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::end(&this->m_FencePool);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<VkFence_T_**,_std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>_>
                        *)&vkFence);
    if (!bVar4) break;
    ppVVar6 = __gnu_cxx::
              __normal_iterator<VkFence_T_**,_std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>_>
              ::operator*(&__end2_1);
    p_Var2 = vkDestroyFence;
    pVVar1 = *ppVVar6;
    pVVar7 = VulkanLogicalDevice::GetVkDevice(this->m_LogicalDevice);
    (*p_Var2)(pVVar7,pVVar1,(VkAllocationCallbacks *)0x0);
    __gnu_cxx::
    __normal_iterator<VkFence_T_**,_std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>_>::
    operator++(&__end2_1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2_1);
  std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::~vector(&this->m_FencePool);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::~vector(&this->m_SemaphorePool);
  std::enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>);
  return;
}

Assistant:

VulkanSyncObjectManager::~VulkanSyncObjectManager()
{
    {
        std::lock_guard<std::mutex> Lock{m_SemaphorePoolGuard};

        for (auto vkSem : m_SemaphorePool)
        {
            vkDestroySemaphore(m_LogicalDevice.GetVkDevice(), vkSem, nullptr);
        }
    }
    {
        std::lock_guard<std::mutex> Lock{m_FencePoolGuard};

        for (auto vkFence : m_FencePool)
        {
            vkDestroyFence(m_LogicalDevice.GetVkDevice(), vkFence, nullptr);
        }
    }
}